

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O1

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinPC07_K,void>::
eval_exc_inc_<double&,int&,double_const*&,double_const*&,double_const*&,double_const*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinPC07_K,void> *this,double *args,int *args_1,
          double **args_2,double **args_3,double **args_4,double **args_5,double **args_6)

{
  double rho;
  uint N;
  const_host_buffer_type rho_00;
  const_host_buffer_type sigma;
  const_host_buffer_type lapl;
  host_buffer_type eps;
  ulong uVar1;
  double sigma_00;
  double dVar2;
  double dStack_48;
  double dStack_40;
  const_host_buffer_type pdStack_38;
  
  dVar2 = *args;
  N = *args_1;
  rho_00 = *args_2;
  sigma = *args_3;
  lapl = *args_4;
  pdStack_38 = *args_5;
  eps = *args_6;
  if (*(int *)(this + 8) == 0) {
    host_eval_exc_inc_helper_polar<ExchCXX::BuiltinPC07_K>(dVar2,N,rho_00,sigma,lapl,pdStack_38,eps)
    ;
    return;
  }
  if (0 < (int)N) {
    uVar1 = 0;
    dStack_40 = dVar2;
    do {
      rho = rho_00[uVar1];
      if (rho <= 1e-15) {
        dStack_48 = 0.0;
      }
      else {
        dVar2 = sigma[uVar1];
        sigma_00 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= dVar2) {
          sigma_00 = dVar2;
        }
        dVar2 = 0.0;
        if (0.0 <= pdStack_38[uVar1]) {
          dVar2 = pdStack_38[uVar1];
        }
        kernel_traits<ExchCXX::BuiltinPC07_K>::eval_exc_unpolar_impl
                  (rho,sigma_00,lapl[uVar1],dVar2,&dStack_48);
        dVar2 = dStack_40;
      }
      eps[uVar1] = dStack_48 * dVar2 + eps[uVar1];
      uVar1 = uVar1 + 1;
    } while (N != uVar1);
  }
  return;
}

Assistant:

void eval_exc_inc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_inc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_inc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }